

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-inl.h
# Opt level: O0

void __thiscall spdlog::spdlog_ex::spdlog_ex(spdlog_ex *this,string *msg,int last_errno)

{
  exception *in_RDI;
  memory_buf_t outbuf;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *this_00;
  string local_170 [55];
  allocator<char> local_139 [9];
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  char *in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff1c;
  buffer<char> *in_stack_ffffffffffffff20;
  
  std::exception::exception(in_RDI);
  *(undefined ***)in_RDI = &PTR__spdlog_ex_00214ad8;
  std::__cxx11::string::string((string *)(in_RDI + 8));
  std::allocator<char>::allocator();
  ::fmt::v8::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::basic_memory_buffer
            (in_stack_fffffffffffffe70,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  std::allocator<char>::~allocator(local_139);
  std::__cxx11::string::c_str();
  this_00 = (basic_memory_buffer<char,_250UL,_std::allocator<char>_> *)(local_139 + 1);
  ::fmt::v8::format_system_error
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff10);
  ::fmt::v8::to_string<char,250ul>(in_stack_fffffffffffffed0);
  std::__cxx11::string::operator=((string *)(in_RDI + 8),local_170);
  std::__cxx11::string::~string(local_170);
  ::fmt::v8::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::~basic_memory_buffer(this_00);
  return;
}

Assistant:

SPDLOG_INLINE spdlog_ex::spdlog_ex(const std::string &msg, int last_errno)
{
    memory_buf_t outbuf;
    fmt::format_system_error(outbuf, last_errno, msg.c_str());
    msg_ = fmt::to_string(outbuf);
}